

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O3

PSocketAddress * p_socket_address_new_any(PSocketFamily family,puint16 port)

{
  PSocketAddress *mem;
  
  mem = (PSocketAddress *)p_malloc0(0x20);
  if (mem == (PSocketAddress *)0x0) {
    mem = (PSocketAddress *)0x0;
    printf("** Error: %s **\n","PSocketAddress::p_socket_address_new_any: failed to allocate memory"
          );
  }
  else {
    if (family == P_SOCKET_FAMILY_INET6) {
      *(undefined8 *)&mem->addr = 0;
      *(undefined8 *)((long)&mem->addr + 8) = 0;
    }
    else {
      if (family != P_SOCKET_FAMILY_INET) {
        p_free(mem);
        return (PSocketAddress *)0x0;
      }
      (mem->addr).sin_addr.s_addr = 0;
    }
    mem->family = family;
    mem->port = port;
  }
  return mem;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_address_new_any (PSocketFamily	family,
			  puint16	port)
{
	PSocketAddress	*ret;
	puchar		any_addr[] = {0, 0, 0, 0};
#ifdef AF_INET6
	struct in6_addr	any6_addr = IN6ADDR_ANY_INIT;
#endif

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocketAddress))) == NULL)) {
		P_ERROR ("PSocketAddress::p_socket_address_new_any: failed to allocate memory");
		return NULL;
	}

	if (family == P_SOCKET_FAMILY_INET)
		memcpy (&ret->addr.sin_addr, any_addr, sizeof (any_addr));
#ifdef AF_INET6
	else if (family == P_SOCKET_FAMILY_INET6)
		memcpy (&ret->addr.sin6_addr, &any6_addr.s6_addr, sizeof (any6_addr.s6_addr));
#endif
	else {
		p_free (ret);
		return NULL;
	}

	ret->family = family;
	ret->port   = port;

	return ret;
}